

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_systemv.cpp
# Opt level: O2

key_t __thiscall
QSystemSemaphoreSystemV::handle
          (QSystemSemaphoreSystemV *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  key_t __key;
  int *piVar5;
  char *__pathname;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1String local_70;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = this->unix_key;
  if (iVar4 != -1) goto LAB_0043c997;
  local_60.d = (self->nativeKey).key.d.d;
  local_60.ptr = (self->nativeKey).key.d.ptr;
  local_60.size = (self->nativeKey).key.d.size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit((QByteArray *)&local_48,(QString *)&local_60);
  pDVar2 = (this->nativeKeyFile).d.d;
  pcVar3 = (char16_t *)(this->nativeKeyFile).d.ptr;
  (this->nativeKeyFile).d.d = (Data *)local_48.d;
  (this->nativeKeyFile).d.ptr = (char *)local_48.ptr;
  qVar1 = (this->nativeKeyFile).d.size;
  (this->nativeKeyFile).d.size = local_48.size;
  local_48.d = (Data *)pDVar2;
  local_48.ptr = pcVar3;
  local_48.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if ((this->nativeKeyFile).d.size == 0) {
    QSystemSemaphore::tr((QString *)&local_60,"%1: key is empty",(char *)0x0,-1);
    local_70.m_size = 0x19;
    local_70.m_data = "QSystemSemaphore::handle:";
    QString::arg<QLatin1String,_true>
              ((QString *)&local_48,(QString *)&local_60,&local_70,0,(QChar)0x20);
  }
  else {
    iVar4 = QtIpcCommon::createUnixKeyFile(&this->nativeKeyFile);
    if (iVar4 == -1) {
      QSystemSemaphore::tr((QString *)&local_60,"%1: unable to make key",(char *)0x0,-1);
      local_70.m_size = 0x19;
      local_70.m_data = "QSystemSemaphore::handle:";
      QString::arg<QLatin1String,_true>
                ((QString *)&local_48,(QString *)&local_60,&local_70,0,(QChar)0x20);
    }
    else {
      this->createdFile = iVar4 == 1;
      __pathname = (this->nativeKeyFile).d.ptr;
      if (__pathname == (char *)0x0) {
        __pathname = &QByteArray::_empty;
      }
      __key = ftok(__pathname,(uint)(self->nativeKey).typeAndFlags.type);
      this->unix_key = __key;
      if (__key != -1) {
        iVar4 = semget(__key,1,0x780);
        this->semaphore = iVar4;
        if (iVar4 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 == 0x11) {
            iVar4 = semget(this->unix_key,1,0x380);
            this->semaphore = iVar4;
            if (iVar4 != -1) goto LAB_0043c87e;
          }
LAB_0043ca1b:
          function.m_data = "QSystemSemaphore::handle";
          function.m_size = 0x18;
          QSystemSemaphorePrivate::setUnixErrorString(self,function);
          cleanHandle(this,self);
          iVar4 = -1;
        }
        else {
          this->createdFile = true;
          this->createdSemaphore = true;
LAB_0043c87e:
          if (mode == Create) {
            this->createdFile = true;
            this->createdSemaphore = true;
LAB_0043c9e9:
            if ((-1 < (long)self->initialValue) &&
               (iVar4 = semctl(iVar4,0,0x10,(long)self->initialValue | 0xaaaaaaaa00000000),
               iVar4 == -1)) goto LAB_0043ca1b;
          }
          else if ((this->createdSemaphore & 1U) != 0) goto LAB_0043c9e9;
          iVar4 = this->unix_key;
        }
        goto LAB_0043c997;
      }
      QSystemSemaphore::tr((QString *)&local_60,"%1: ftok failed",(char *)0x0,-1);
      local_70.m_size = 0x19;
      local_70.m_data = "QSystemSemaphore::handle:";
      QString::arg<QLatin1String,_true>
                ((QString *)&local_48,(QString *)&local_60,&local_70,0,(QChar)0x20);
    }
  }
  iVar4 = -1;
  self->error = KeyError;
  QString::operator=(&self->errorString,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
LAB_0043c997:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

key_t QSystemSemaphoreSystemV::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (unix_key != -1)
        return unix_key;  // we already have a semaphore

#if defined(Q_OS_DARWIN)
    if (qt_apple_isSandboxed()) {
        // attempting to use System V semaphores will get us a SIGSYS
        self->setError(QSystemSemaphore::PermissionDenied,
                       QSystemSemaphore::tr("%1: System V semaphores are not available for "
                                            "sandboxed applications. Please build Qt with "
                                            "-feature-ipc_posix")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }
#endif

    nativeKeyFile = QFile::encodeName(self->nativeKey.nativeKey());
    if (nativeKeyFile.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // ftok requires that an actual file exists somewhere
    int built = QtIpcCommon::createUnixKeyFile(nativeKeyFile);
    if (-1 == built) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: unable to make key")
                       .arg("QSystemSemaphore::handle:"_L1));

        return -1;
    }
    createdFile = (1 == built);

    // Get the unix key for the created file
    unix_key = ftok(nativeKeyFile, int(self->nativeKey.type()));
    if (-1 == unix_key) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: ftok failed")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // Get semaphore
    semaphore = semget(unix_key, 1, 0600 | IPC_CREAT | IPC_EXCL);
    if (-1 == semaphore) {
        if (errno == EEXIST)
            semaphore = semget(unix_key, 1, 0600 | IPC_CREAT);
        if (-1 == semaphore) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    } else {
        createdSemaphore = true;
        // Force cleanup of file, it is possible that it can be left over from a crash
        createdFile = true;
    }

    if (mode == QSystemSemaphore::Create) {
        createdSemaphore = true;
        createdFile = true;
    }

    // Created semaphore so initialize its value.
    if (createdSemaphore && self->initialValue >= 0) {
        qt_semun init_op;
        init_op.val = self->initialValue;
        if (-1 == semctl(semaphore, 0, SETVAL, init_op)) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    }

    return unix_key;
}